

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

string * __thiscall
comparer_context::print_hierarchy_abi_cxx11_(string *__return_storage_ptr__,comparer_context *this)

{
  comparer_context *pcVar1;
  string *psVar2;
  ostream *poVar3;
  _Elt_pointer ppVar4;
  pointer __s;
  _Elt_pointer ppVar5;
  pointer pbVar6;
  _Elt_pointer ppVar7;
  string pad;
  stringstream ss;
  allocator<char> local_219;
  _Map_pointer local_218;
  char *local_210;
  long local_208;
  char local_200;
  undefined7 uStack_1ff;
  comparer_context *local_1f0;
  string *local_1e8;
  _Elt_pointer local_1e0;
  key_type local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ppVar7 = (this->history).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar5 = (this->history).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar4 = ppVar7;
  if (ppVar7 == ppVar5) {
    ppVar4 = (this->history).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 6;
  }
  __s = ppVar4[-1].first._M_dataplus._M_p;
  local_210 = &local_200;
  local_208 = 0;
  local_200 = '\0';
  local_1e0 = (this->history).
              super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_218 = (this->history).
              super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_1f0 = this;
  local_1e8 = __return_storage_ptr__;
  for (; ppVar7 != local_1e0; ppVar7 = ppVar7 + -1) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_210,local_208);
    ppVar4 = ppVar7;
    if (ppVar7 == ppVar5) {
      ppVar4 = local_218[-1] + 6;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,ppVar4[-1].first._M_dataplus._M_p,ppVar4[-1].first._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(Index: ",8);
    ppVar4 = ppVar7;
    if (ppVar7 == ppVar5) {
      ppVar4 = local_218[-1] + 6;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,__s,&local_219);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::operator[](&ppVar4[-1].second,&local_1d8);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    ppVar4 = ppVar7;
    if (ppVar7 == ppVar5) {
      ppVar4 = local_218[-1] + 6;
    }
    __s = ppVar4[-1].first._M_dataplus._M_p;
    if (ppVar7 == ppVar5) {
      ppVar5 = local_218[-1];
      local_218 = local_218 + -1;
      ppVar7 = ppVar5 + 6;
    }
    std::__cxx11::string::append((char *)&local_210);
  }
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
  psVar2 = local_1e8;
  std::ostream::put((char)local_1a8);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Debug trace: ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  pcVar1 = local_1f0;
  pbVar6 = (local_1f0->debug_trace).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar6 != (local_1f0->debug_trace).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != (pcVar1->debug_trace).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string print_hierarchy() {
        std::stringstream ss;
        ss << "\n";

        const char* last = history.back().first.c_str();
        std::string pad;

        for(ChunkHistory::reverse_iterator rev = history.rbegin(),
            end = history.rend(); rev != end; ++rev, pad += "  ")
        {
            ss << pad << (*rev).first << "(Index: " << (*rev).second[last] << ")" << "\n";
            last = (*rev).first.c_str();
        }

        ss << std::endl << "Debug trace: "<< "\n";
        for (std::vector<std::string>::const_iterator it = debug_trace.begin(); it != debug_trace.end(); ++it) {
            ss << *it << "\n";
        }
        ss << std::flush;

        return ss.str();
    }